

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_ptr_array.c
# Opt level: O0

int zt_ptr_array_move_idx_to_idx(zt_ptr_array *array,int32_t src_idx,int32_t dst_idx)

{
  int32_t dst_idx_local;
  int32_t src_idx_local;
  zt_ptr_array *array_local;
  int local_4;
  
  if (array->count < src_idx) {
    local_4 = -1;
  }
  else if (array->count < dst_idx) {
    local_4 = -1;
  }
  else {
    array->array[dst_idx] = array->array[src_idx];
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int
zt_ptr_array_move_idx_to_idx(zt_ptr_array * array, int32_t src_idx, int32_t dst_idx) {
    if (src_idx > array->count) {
        return -1;
    }

    if (dst_idx > array->count) {
        return -1;
    }

    array->array[dst_idx] = array->array[src_idx];

    return 0;
}